

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_parser_extras.h
# Opt level: O3

bool shader_integer_mix(_mesa_glsl_parse_state *state)

{
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = state->forced_language_version;
  if (uVar2 == 0) {
    uVar2 = state->language_version;
  }
  uVar3 = 0x1c1;
  if (state->es_shader != false) {
    uVar3 = 0x135;
  }
  uVar1 = 1;
  if ((uVar2 <= uVar3) && (state->ARB_ES3_1_compatibility_enable == false)) {
    uVar3 = 0x81;
    if (state->es_shader != false) {
      uVar3 = 299;
    }
    if (uVar2 <= uVar3) {
      return false;
    }
    uVar1 = state->EXT_shader_integer_mix_enable;
  }
  return (bool)uVar1;
}

Assistant:

bool is_version(unsigned required_glsl_version,
                   unsigned required_glsl_es_version) const
   {
      unsigned required_version = this->es_shader ?
         required_glsl_es_version : required_glsl_version;
      unsigned this_version = this->forced_language_version
         ? this->forced_language_version : this->language_version;
      return required_version != 0
         && this_version >= required_version;
   }